

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O1

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,false>
::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,false>
           *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *dst)

{
  double dVar1;
  PointerType pdVar2;
  PointerType pdVar3;
  long *plVar4;
  long lVar5;
  bool bVar6;
  void *__s;
  undefined8 *puVar7;
  char *__function;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Index size;
  size_t __size;
  
  pdVar2 = *(PointerType *)(this + 8);
  pdVar3 = (dst->
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
           m_data;
  if (pdVar3 == pdVar2) {
    plVar4 = *(long **)this;
    lVar11 = plVar4[1];
    __size = (size_t)(int)lVar11;
    lVar11 = lVar11 << 0x20;
    if (lVar11 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc(__size);
      if (__s == (void *)0x0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = std::streambuf::xsgetn;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    if ((long)__size < 0) {
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                    ,0xe1,
                    "Eigen::Matrix<bool, -1, 1, 0, -1>::Matrix(Index) [_Scalar = bool, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
    if (lVar11 != 0) {
      memset(__s,0,__size);
      lVar11 = 0;
      do {
        bVar6 = true;
        lVar9 = lVar11;
        while( true ) {
          if (lVar11 < 0) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x17a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<bool, -1, 1, 0, -1>, 1>::operator[](Index) [Derived = Eigen::Matrix<bool, -1, 1, 0, -1>, Level = 1]"
                         );
          }
          if (*(char *)((long)__s + lVar9) != '\x01') break;
          lVar9 = lVar9 + 1;
          bVar6 = lVar9 < (long)__size;
          if ((long)__size <= lVar9) goto LAB_00166ce5;
        }
        if (!bVar6) break;
        *(undefined1 *)((long)__s + lVar9) = 1;
        lVar11 = *plVar4;
        iVar8 = *(int *)(lVar11 + lVar9 * 4);
        while (lVar10 = (long)iVar8, lVar10 != lVar9) {
          if (((iVar8 < 0) ||
              (lVar5 = (dst->
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                       ).
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                       .m_rows.m_value, lVar5 <= lVar10)) || (lVar5 <= lVar9)) goto LAB_00166cfb;
          dVar1 = pdVar3[lVar10];
          pdVar3[lVar10] = pdVar3[lVar9];
          pdVar3[lVar9] = dVar1;
          *(undefined1 *)((long)__s + lVar10) = 1;
          iVar8 = *(int *)(lVar11 + lVar10 * 4);
        }
        lVar11 = lVar9 + 1;
      } while (lVar11 < (long)__size);
    }
LAB_00166ce5:
    free(__s);
    return;
  }
  lVar11 = *(long *)(this + 0x10);
  if (0 < lVar11) {
    plVar4 = *(long **)this;
    lVar9 = 0;
    do {
      if (*(long *)(this + 0x10) <= lVar9) {
        __function = 
        "Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00166d27;
      }
      lVar10 = (long)*(int *)(*plVar4 + lVar9 * 4);
      if ((lVar10 < 0) ||
         ((dst->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
          ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.
          m_rows.m_value <= lVar10)) goto LAB_00166cfb;
      pdVar3[lVar10] = pdVar2[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar11 != lVar9);
  }
  return;
LAB_00166cfb:
  __function = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00166d27:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                ,0x76,__function);
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && extract_data(dst) == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }